

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::SingleVertexArrayFirstTests::init
          (SingleVertexArrayFirstTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  SingleVertexArrayFirstGroup *this_00;
  int local_20;
  InputType IStack_1c;
  int inputTypeNdx;
  InputType inputTypes [3];
  SingleVertexArrayFirstTests *this_local;
  
  _IStack_1c = 0x300000000;
  iVar1 = 0xb;
  inputTypes[0] = INPUTTYPE_INT_2_10_10_10;
  local_20 = 0;
  inputTypes._4_8_ = this;
  while (local_20 < 3) {
    this_00 = (SingleVertexArrayFirstGroup *)operator_new(0x80);
    SingleVertexArrayFirstGroup::SingleVertexArrayFirstGroup
              (this_00,(this->super_TestCaseGroup).m_context,(&IStack_1c)[local_20]);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    iVar1 = local_20 + 1;
    local_20 = iVar1;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayFirstTests::init (void)
{
	// Test offset with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_INT_2_10_10_10 };

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		addChild(new SingleVertexArrayFirstGroup(m_context, inputTypes[inputTypeNdx]));
	}
}